

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc.cc
# Opt level: O2

void __thiscall
TCMallocImplementation::GetHeapSample(TCMallocImplementation *this,MallocExtensionWriter *writer)

{
  if (FLAG__namespace_do_not_use_directly_use_DECLARE_int64_t_instead::
      FLAGS_tcmalloc_sample_parameter == 0) {
    std::__cxx11::string::append((char *)writer,0x139c9f);
  }
  MallocExtension::GetHeapSample(&this->super_MallocExtension,writer);
  return;
}

Assistant:

virtual void GetHeapSample(MallocExtensionWriter* writer) {
    if (FLAGS_tcmalloc_sample_parameter == 0) {
      const char* const kWarningMsg =
          "%warn\n"
          "%warn This heap profile does not have any data in it, because\n"
          "%warn the application was run with heap sampling turned off.\n"
          "%warn To get useful data from GetHeapSample(), you must\n"
          "%warn set the environment variable TCMALLOC_SAMPLE_PARAMETER to\n"
          "%warn a positive sampling period, such as 524288.\n"
          "%warn\n";
      writer->append(kWarningMsg, strlen(kWarningMsg));
    }
    MallocExtension::GetHeapSample(writer);
  }